

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O3

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  ulong uVar1;
  
  if (args_info->input_arg != (char *)0x0) {
    free(args_info->input_arg);
    args_info->input_arg = (char *)0x0;
  }
  if (args_info->input_orig != (char *)0x0) {
    free(args_info->input_orig);
    args_info->input_orig = (char *)0x0;
  }
  if (args_info->output_arg != (char *)0x0) {
    free(args_info->output_arg);
    args_info->output_arg = (char *)0x0;
  }
  if (args_info->output_orig != (char *)0x0) {
    free(args_info->output_orig);
    args_info->output_orig = (char *)0x0;
  }
  if (args_info->sele1_arg != (char *)0x0) {
    free(args_info->sele1_arg);
    args_info->sele1_arg = (char *)0x0;
  }
  if (args_info->sele1_orig != (char *)0x0) {
    free(args_info->sele1_orig);
    args_info->sele1_orig = (char *)0x0;
  }
  if (args_info->sele2_arg != (char *)0x0) {
    free(args_info->sele2_arg);
    args_info->sele2_arg = (char *)0x0;
  }
  if (args_info->sele2_orig != (char *)0x0) {
    free(args_info->sele2_orig);
    args_info->sele2_orig = (char *)0x0;
  }
  if (args_info->nbins_orig != (char *)0x0) {
    free(args_info->nbins_orig);
    args_info->nbins_orig = (char *)0x0;
  }
  if (args_info->nbins_z_orig != (char *)0x0) {
    free(args_info->nbins_z_orig);
    args_info->nbins_z_orig = (char *)0x0;
  }
  if (args_info->privilegedAxis_orig != (char *)0x0) {
    free(args_info->privilegedAxis_orig);
    args_info->privilegedAxis_orig = (char *)0x0;
  }
  if (args_info->centroidX_orig != (char *)0x0) {
    free(args_info->centroidX_orig);
    args_info->centroidX_orig = (char *)0x0;
  }
  if (args_info->centroidY_orig != (char *)0x0) {
    free(args_info->centroidY_orig);
    args_info->centroidY_orig = (char *)0x0;
  }
  if (args_info->referenceZ_orig != (char *)0x0) {
    free(args_info->referenceZ_orig);
    args_info->referenceZ_orig = (char *)0x0;
  }
  if (args_info->dropletR_orig != (char *)0x0) {
    free(args_info->dropletR_orig);
    args_info->dropletR_orig = (char *)0x0;
  }
  if (args_info->threshDens_orig != (char *)0x0) {
    free(args_info->threshDens_orig);
    args_info->threshDens_orig = (char *)0x0;
  }
  if (args_info->bufferLength_orig != (char *)0x0) {
    free(args_info->bufferLength_orig);
    args_info->bufferLength_orig = (char *)0x0;
  }
  if (args_info->rcut_orig != (char *)0x0) {
    free(args_info->rcut_orig);
    args_info->rcut_orig = (char *)0x0;
  }
  if (args_info->inputs_num != 0) {
    uVar1 = 0;
    do {
      free(args_info->inputs[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < args_info->inputs_num);
    if (args_info->inputs_num != 0) {
      free(args_info->inputs);
    }
  }
  args_info->sequentialProps_group_counter = 0;
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->input_given = 0;
  args_info->output_given = 0;
  args_info->sele1_given = 0;
  args_info->sele2_given = 0;
  args_info->nbins_given = 0;
  args_info->nbins_z_given = 0;
  args_info->privilegedAxis_given = 0;
  args_info->centroidX_given = 0;
  args_info->centroidY_given = 0;
  args_info->referenceZ_given = 0;
  args_info->dropletR_given = 0;
  args_info->threshDens_given = 0;
  args_info->bufferLength_given = 0;
  args_info->rcut_given = 0;
  args_info->com_given = 0;
  args_info->comvel_given = 0;
  args_info->deltaCount_given = 0;
  args_info->fluxOut_given = 0;
  args_info->ca1_given = 0;
  args_info->ca2_given = 0;
  args_info->gcn_given = 0;
  args_info->testequi_given = 0;
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->input_arg));
  free_string_field (&(args_info->input_orig));
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->sele1_arg));
  free_string_field (&(args_info->sele1_orig));
  free_string_field (&(args_info->sele2_arg));
  free_string_field (&(args_info->sele2_orig));
  free_string_field (&(args_info->nbins_orig));
  free_string_field (&(args_info->nbins_z_orig));
  free_string_field (&(args_info->privilegedAxis_orig));
  free_string_field (&(args_info->centroidX_orig));
  free_string_field (&(args_info->centroidY_orig));
  free_string_field (&(args_info->referenceZ_orig));
  free_string_field (&(args_info->dropletR_orig));
  free_string_field (&(args_info->threshDens_orig));
  free_string_field (&(args_info->bufferLength_orig));
  free_string_field (&(args_info->rcut_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}